

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::AppendPolygon(Clipper *this,TEdge *e1,TEdge *e2)

{
  int iVar1;
  int iVar2;
  pointer ppOVar3;
  OutRec *outRec1;
  OutRec *outRec2;
  OutPt *pOVar4;
  OutPt *pOVar5;
  OutPt *pOVar6;
  TEdge *pTVar7;
  pointer ppJVar8;
  pointer ppHVar9;
  HorzJoinRec *pHVar10;
  EdgeSide EVar11;
  bool bVar12;
  OutRec *pOVar13;
  ulong uVar14;
  TEdge **ppTVar15;
  JoinRec *pJVar16;
  OutPt *pp;
  
  ppOVar3 = (this->m_PolyOuts).
            super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  outRec1 = ppOVar3[e1->outIdx];
  outRec2 = ppOVar3[e2->outIdx];
  bVar12 = Param1RightOfParam2(outRec1,outRec2);
  pOVar13 = outRec2;
  if (!bVar12) {
    bVar12 = Param1RightOfParam2(outRec2,outRec1);
    pOVar13 = outRec1;
    if (!bVar12) {
      pOVar13 = GetLowermostRec(outRec1,outRec2);
    }
  }
  pOVar4 = outRec1->pts;
  pOVar5 = pOVar4->prev;
  pp = outRec2->pts;
  pOVar6 = pp->prev;
  if (e1->side == esLeft) {
    if (e2->side == esLeft) {
      ReversePolyPtLinks(pp);
      pp->next = pOVar4;
      pOVar4->prev = pp;
      pOVar5->next = pOVar6;
      pOVar6->prev = pOVar5;
      pp = pOVar6;
    }
    else {
      pOVar6->next = pOVar4;
      pOVar4->prev = pOVar6;
      pp->prev = pOVar5;
      pOVar5->next = pp;
    }
    outRec1->pts = pp;
    EVar11 = esLeft;
  }
  else {
    if (e2->side == esRight) {
      ReversePolyPtLinks(pp);
      pOVar5->next = pOVar6;
      pOVar6->prev = pOVar5;
      pp->next = pOVar4;
      pOVar4->prev = pp;
    }
    else {
      pOVar5->next = pp;
      pp->prev = pOVar5;
      pOVar4->prev = pOVar6;
      pOVar6->next = pOVar4;
    }
    EVar11 = esRight;
  }
  if (pOVar13 == outRec2) {
    pOVar4 = outRec2->bottomPt;
    outRec1->bottomPt = pOVar4;
    pOVar4->idx = outRec1->idx;
    if (outRec2->FirstLeft != outRec1) {
      outRec1->FirstLeft = outRec2->FirstLeft;
    }
    outRec1->isHole = outRec2->isHole;
  }
  outRec2->pts = (OutPt *)0x0;
  outRec2->bottomPt = (OutPt *)0x0;
  outRec2->AppendLink = outRec1;
  iVar1 = e1->outIdx;
  iVar2 = e2->outIdx;
  e1->outIdx = -1;
  e2->outIdx = -1;
  ppTVar15 = &this->m_ActiveEdges;
  do {
    pTVar7 = *ppTVar15;
    if (pTVar7 == (TEdge *)0x0) {
LAB_0055d020:
      for (uVar14 = 0;
          ppJVar8 = (this->m_Joins).
                    super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          uVar14 < (ulong)((long)(this->m_Joins).
                                 super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppJVar8 >> 3);
          uVar14 = uVar14 + 1) {
        pJVar16 = ppJVar8[uVar14];
        if (pJVar16->poly1Idx == iVar2) {
          pJVar16->poly1Idx = iVar1;
          pJVar16 = (this->m_Joins).
                    super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar14];
        }
        if (pJVar16->poly2Idx == iVar2) {
          pJVar16->poly2Idx = iVar1;
        }
      }
      for (uVar14 = 0;
          ppHVar9 = (this->m_HorizJoins).
                    super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          uVar14 < (ulong)((long)(this->m_HorizJoins).
                                 super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppHVar9 >> 3);
          uVar14 = uVar14 + 1) {
        pHVar10 = ppHVar9[uVar14];
        if (pHVar10->savedIdx == iVar2) {
          pHVar10->savedIdx = iVar1;
        }
      }
      return;
    }
    if (pTVar7->outIdx == iVar2) {
      pTVar7->outIdx = iVar1;
      pTVar7->side = EVar11;
      goto LAB_0055d020;
    }
    ppTVar15 = &pTVar7->nextInAEL;
  } while( true );
}

Assistant:

void Clipper::AppendPolygon(TEdge *e1, TEdge *e2)
{
  //get the start and ends of both output polygons ...
  OutRec *outRec1 = m_PolyOuts[e1->outIdx];
  OutRec *outRec2 = m_PolyOuts[e2->outIdx];

  OutRec *holeStateRec;
  if (Param1RightOfParam2(outRec1, outRec2)) holeStateRec = outRec2;
  else if (Param1RightOfParam2(outRec2, outRec1)) holeStateRec = outRec1;
  else holeStateRec = GetLowermostRec(outRec1, outRec2);

  OutPt* p1_lft = outRec1->pts;
  OutPt* p1_rt = p1_lft->prev;
  OutPt* p2_lft = outRec2->pts;
  OutPt* p2_rt = p2_lft->prev;

  EdgeSide side;
  //join e2 poly onto e1 poly and delete pointers to e2 ...
  if(  e1->side == esLeft )
  {
    if(  e2->side == esLeft )
    {
      //z y x a b c
      ReversePolyPtLinks(*p2_lft);
      p2_lft->next = p1_lft;
      p1_lft->prev = p2_lft;
      p1_rt->next = p2_rt;
      p2_rt->prev = p1_rt;
      outRec1->pts = p2_rt;
    } else
    {
      //x y z a b c
      p2_rt->next = p1_lft;
      p1_lft->prev = p2_rt;
      p2_lft->prev = p1_rt;
      p1_rt->next = p2_lft;
      outRec1->pts = p2_lft;
    }
    side = esLeft;
  } else
  {
    if(  e2->side == esRight )
    {
      //a b c z y x
      ReversePolyPtLinks( *p2_lft );
      p1_rt->next = p2_rt;
      p2_rt->prev = p1_rt;
      p2_lft->next = p1_lft;
      p1_lft->prev = p2_lft;
    } else
    {
      //a b c x y z
      p1_rt->next = p2_lft;
      p2_lft->prev = p1_rt;
      p1_lft->prev = p2_rt;
      p2_rt->next = p1_lft;
    }
    side = esRight;
  }

  if (holeStateRec == outRec2)
  {
    outRec1->bottomPt = outRec2->bottomPt;
    outRec1->bottomPt->idx = outRec1->idx;
    if (outRec2->FirstLeft != outRec1)
      outRec1->FirstLeft = outRec2->FirstLeft;
    outRec1->isHole = outRec2->isHole;
  }
  outRec2->pts = 0;
  outRec2->bottomPt = 0;
  outRec2->AppendLink = outRec1;
  int OKIdx = e1->outIdx;
  int ObsoleteIdx = e2->outIdx;

  e1->outIdx = -1; //nb: safe because we only get here via AddLocalMaxPoly
  e2->outIdx = -1;

  TEdge* e = m_ActiveEdges;
  while( e )
  {
    if( e->outIdx == ObsoleteIdx )
    {
      e->outIdx = OKIdx;
      e->side = side;
      break;
    }
    e = e->nextInAEL;
  }

  for (JoinList::size_type i = 0; i < m_Joins.size(); ++i)
  {
      if (m_Joins[i]->poly1Idx == ObsoleteIdx) m_Joins[i]->poly1Idx = OKIdx;
      if (m_Joins[i]->poly2Idx == ObsoleteIdx) m_Joins[i]->poly2Idx = OKIdx;
  }

  for (HorzJoinList::size_type i = 0; i < m_HorizJoins.size(); ++i)
  {
      if (m_HorizJoins[i]->savedIdx == ObsoleteIdx)
        m_HorizJoins[i]->savedIdx = OKIdx;
  }

}